

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O0

void __thiscall TestClass::ProcessFunc2(TestClass *this,Event2 *ev)

{
  undefined1 local_28 [4];
  int elapsed;
  timeval curTime;
  Event2 *ev_local;
  TestClass *this_local;
  
  curTime.tv_usec = (__suseconds_t)ev;
  TimeUtils::getCurTime((timeval *)local_28);
  TimeUtils::getDifference((timeval *)local_28,(timeval *)(curTime.tv_usec + 0x20));
  return;
}

Assistant:

void TestClass::ProcessFunc2( Event2 *ev )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	LOG_NOTICE( "p1 %d p2 %d", ev->mP1, ev->mP2 );
	struct timeval curTime;
	TimeUtils::getCurTime( &curTime );
	
	int elapsed = TimeUtils::getDifference( &curTime, &ev->mSent );
	
	LOG("Received Func2 timed event, elapsed time is %d", elapsed);
}